

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_decoder.cc
# Opt level: O2

void __thiscall draco::ObjDecoder::ObjDecoder(ObjDecoder *this)

{
  this->counting_mode_ = true;
  this->num_obj_faces_ = 0;
  this->num_positions_ = 0;
  this->num_tex_coords_ = 0;
  this->num_normals_ = 0;
  this->num_materials_ = 0;
  this->last_sub_obj_id_ = 0;
  this->pos_att_id_ = -1;
  this->tex_att_id_ = -1;
  this->norm_att_id_ = -1;
  this->material_att_id_ = -1;
  this->sub_obj_att_id_ = -1;
  this->added_edge_att_id_ = -1;
  this->deduplicate_input_values_ = true;
  this->last_material_id_ = 0;
  (this->material_file_name_)._M_dataplus._M_p = (pointer)&(this->material_file_name_).field_2;
  (this->material_file_name_)._M_string_length = 0;
  (this->material_file_name_).field_2._M_local_buf[0] = '\0';
  (this->input_file_name_)._M_dataplus._M_p = (pointer)&(this->input_file_name_).field_2;
  (this->input_file_name_)._M_string_length = 0;
  (this->input_file_name_).field_2._M_local_buf[0] = '\0';
  (this->material_name_to_id_)._M_h._M_buckets = &(this->material_name_to_id_)._M_h._M_single_bucket
  ;
  (this->material_name_to_id_)._M_h._M_bucket_count = 1;
  (this->material_name_to_id_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->material_name_to_id_)._M_h._M_element_count = 0;
  (this->material_name_to_id_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->material_name_to_id_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->material_name_to_id_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->obj_name_to_id_)._M_h._M_buckets = &(this->obj_name_to_id_)._M_h._M_single_bucket;
  (this->obj_name_to_id_)._M_h._M_bucket_count = 1;
  (this->obj_name_to_id_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->obj_name_to_id_)._M_h._M_element_count = 0;
  (this->obj_name_to_id_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  this->mesh_files_ =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0;
  (this->obj_name_to_id_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->obj_name_to_id_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  *(undefined4 *)((long)&(this->obj_name_to_id_)._M_h._M_single_bucket + 7) = 0;
  DecoderBuffer::DecoderBuffer(&this->buffer_);
  this->out_mesh_ = (Mesh *)0x0;
  this->out_point_cloud_ = (PointCloud *)0x0;
  return;
}

Assistant:

ObjDecoder::ObjDecoder()
    : counting_mode_(true),
      num_obj_faces_(0),
      num_positions_(0),
      num_tex_coords_(0),
      num_normals_(0),
      num_materials_(0),
      last_sub_obj_id_(0),
      pos_att_id_(-1),
      tex_att_id_(-1),
      norm_att_id_(-1),
      material_att_id_(-1),
      sub_obj_att_id_(-1),
      added_edge_att_id_(-1),
      deduplicate_input_values_(true),
      last_material_id_(0),
      use_metadata_(false),
      preserve_polygons_(false),
      has_polygons_(false),
      mesh_files_(nullptr),
      out_mesh_(nullptr),
      out_point_cloud_(nullptr) {}